

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

PackageMempoolAcceptResult *
ProcessNewPackage(PackageMempoolAcceptResult *__return_storage_ptr__,Chainstate *active_chainstate,
                 CTxMemPool *pool,Package *package,bool test_accept,
                 optional<CFeeRate> *client_maxfeerate)

{
  TxValidationResult TVar1;
  CChainParams *pCVar2;
  element_type *peVar3;
  uchar *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  PackageValidationState state;
  PackageValidationState state_00;
  PackageValidationState state_01;
  PackageValidationState state_02;
  TxValidationState state_03;
  TxValidationState state_04;
  PackageValidationState state_05;
  bool bVar9;
  int64_t iVar10;
  pointer pcVar11;
  CTxMemPoolEntry *pCVar12;
  CTxMemPoolEntry **ppCVar13;
  undefined1 *extraout_RAX;
  undefined1 *puVar14;
  const_iterator cVar15;
  mapped_type *pmVar16;
  iterator iVar17;
  CCoinsViewCache *pCVar18;
  pointer psVar19;
  COutPoint *hashTx;
  pointer pCVar20;
  COutPoint *hash;
  Txid *txid;
  long lVar21;
  ulong uVar22;
  _Base_ptr p_Var23;
  long *plVar24;
  CTxIn *input;
  pointer pCVar25;
  value_type *__x;
  Wtxid *__args;
  pointer psVar26;
  pointer pCVar27;
  pointer psVar28;
  long lVar29;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  pVar30;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  vector<COutPoint,_std::allocator<COutPoint>_> coins_to_uncache;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  txns_package_eval;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  unconfirmed_parent_txids;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  BlockValidationState state_dummy;
  TxValidationState mempool_full_state;
  PackageMempoolAcceptResult multi_submission_result;
  ATMPArgs args;
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  individual_results_nonfinal;
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  results_final;
  PackageValidationState package_state_quit_early;
  undefined8 in_stack_fffffffffffff868;
  undefined8 in_stack_fffffffffffff870;
  pointer __args_00;
  undefined8 in_stack_fffffffffffff880;
  PackageMempoolAcceptResult *pPVar31;
  byte in_stack_fffffffffffff888;
  undefined7 in_stack_fffffffffffff889;
  undefined8 in_stack_fffffffffffff890;
  Chainstate *pCVar32;
  value_type *in_stack_fffffffffffff898;
  undefined8 in_stack_fffffffffffff8a0;
  value_type *pvVar33;
  COutPoint *pCVar34;
  COutPoint *pCStack_750;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_738;
  _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_718;
  ATMPArgs local_6d0;
  unique_lock<std::recursive_mutex> local_690;
  undefined1 local_680 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_668;
  _Alloc_hider local_658;
  size_type local_650;
  undefined1 local_648 [248];
  CoinsCachePair *local_550;
  CoinsCachePair *local_548;
  uint8_t local_540;
  direct_or_indirect local_530;
  uint local_514;
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_508;
  undefined **local_4b0;
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::allocator<std::pair<const_COutPoint,_Coin>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_4a0;
  _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_458;
  CCoinsView local_408;
  Chainstate *local_400;
  _Rb_tree<_270907ca_> local_3e0;
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_3b0;
  undefined1 local_388 [8];
  long *local_380;
  long local_370 [2];
  long *local_360 [2];
  long local_350 [2];
  undefined1 local_340 [8];
  long *local_338;
  long local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  string local_2f8;
  ValidationState<TxValidationResult> local_2d8;
  undefined1 local_290 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_288;
  undefined1 local_280 [24];
  pointer local_268 [2];
  undefined1 local_258 [16];
  undefined1 local_248 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_230;
  _Alloc_hider local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  local_200;
  undefined1 local_1c8 [8];
  undefined1 auStack_1c0 [8];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  _Alloc_hider local_198;
  _Base_ptr local_190;
  undefined1 local_188 [16];
  _Rb_tree_node_base local_178;
  bool local_158;
  _Storage<long,_true> local_150;
  bool local_148;
  bool local_138;
  _Storage<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false>
  local_130;
  bool local_118;
  _Storage<uint256,_true> local_110;
  bool local_f0;
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  local_e0;
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  local_b0;
  element_type *local_80;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  pointer local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  uint64_t local_38;
  
  local_38 = *(uint64_t *)(in_FS_OFFSET + 0x28);
  psVar19 = (package->
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar26 = (package->
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar19 == psVar26) {
    __assert_fail("!package.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0x764,
                  "PackageMempoolAcceptResult ProcessNewPackage(Chainstate &, CTxMemPool &, const Package &, bool, const std::optional<CFeeRate> &)"
                 );
  }
  uVar22 = (long)psVar26 - (long)psVar19;
  if (0 < (long)uVar22 >> 6) {
    psVar28 = (pointer)((long)&(psVar19->
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + (uVar22 & 0xffffffffffffffc0));
    lVar21 = ((long)uVar22 >> 6) + 1;
    psVar19 = psVar19 + 2;
    do {
      if (psVar19[-2].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        psVar19 = psVar19 + -2;
        goto LAB_003f68fb;
      }
      if (psVar19[-1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        psVar19 = psVar19 + -1;
        goto LAB_003f68fb;
      }
      if ((psVar19->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
          (element_type *)0x0) goto LAB_003f68fb;
      if (psVar19[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        psVar19 = psVar19 + 1;
        goto LAB_003f68fb;
      }
      lVar21 = lVar21 + -1;
      psVar19 = psVar19 + 4;
    } while (1 < lVar21);
    uVar22 = (long)psVar26 - (long)psVar28;
    psVar19 = psVar28;
  }
  lVar21 = (long)uVar22 >> 4;
  if (lVar21 == 1) {
LAB_003f68de:
    if ((psVar19->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0) {
      psVar19 = psVar26;
    }
LAB_003f68fb:
    if (psVar19 != psVar26) {
      __assert_fail("std::all_of(package.cbegin(), package.cend(), [](const auto& tx){return tx != nullptr;})"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                    ,0x765,
                    "PackageMempoolAcceptResult ProcessNewPackage(Chainstate &, CTxMemPool &, const Package &, bool, const std::optional<CFeeRate> &)"
                   );
    }
  }
  else {
    if (lVar21 == 2) {
LAB_003f68d4:
      if ((psVar19->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
          (element_type *)0x0) {
        psVar19 = psVar19 + 1;
        goto LAB_003f68de;
      }
      goto LAB_003f68fb;
    }
    if (lVar21 == 3) {
      if ((psVar19->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
          (element_type *)0x0) {
        psVar19 = psVar19 + 1;
        goto LAB_003f68d4;
      }
      goto LAB_003f68fb;
    }
  }
  hash = (COutPoint *)0x0;
  pCStack_750 = (COutPoint *)0x0;
  pCVar2 = (active_chainstate->m_chainman->m_options).chainparams;
  if (test_accept) {
    iVar10 = GetTime();
    local_1c8._0_4_ = SUB84(pCVar2,0);
    local_1c8._4_4_ = (undefined4)((ulong)pCVar2 >> 0x20);
    auStack_1c0._0_4_ = (undefined4)iVar10;
    auStack_1c0._4_4_ = (undefined4)((ulong)iVar10 >> 0x20);
    local_1b8._0_4_ = local_1b8._0_4_ & 0xffffff00;
    local_1b8._8_8_ = &stack0xfffffffffffff8a8;
    local_1a8[0] = true;
    local_198._M_p = local_198._M_p & 0xffffffffffffff00;
    local_1a8[1] = '\0';
    local_1a8[2] = '\0';
    local_1a8[3] = '\0';
    local_1a8[4] = '\0';
    local_190 = (_Base_ptr)((ulong)local_190 & 0xffffffffffffff00);
    anon_unknown.dwarf_12ac559::MemPoolAccept::MemPoolAccept
              ((MemPoolAccept *)local_680,pool,active_chainstate);
    anon_unknown.dwarf_12ac559::MemPoolAccept::AcceptMultipleTransactions
              (__return_storage_ptr__,(MemPoolAccept *)local_680,package,(ATMPArgs *)local_1c8);
    std::__cxx11::
    _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::_M_clear(&local_3b0);
    std::_Rb_tree<$270907ca$>::~_Rb_tree(&local_3e0);
    local_4b0 = &PTR_GetCoin_00b255a8;
    std::
    _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_458);
    std::
    _Hashtable<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::allocator<std::pair<const_COutPoint,_Coin>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_4a0);
    local_680._8_8_ = &PTR_GetCoin_00b2a3f0;
    std::
    _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_508);
    if (local_540 != '\0') {
      (local_548->second).m_prev = local_550;
      (local_550->second).m_next = local_548;
      local_540 = '\0';
    }
    if (0x1c < local_514) {
      free(local_530.indirect_contents.indirect);
      local_530.indirect_contents.indirect = (char *)0x0;
    }
    PoolResource<144UL,_8UL>::~PoolResource((PoolResource<144UL,_8UL> *)(local_648 + 8));
    pCVar34 = hash;
  }
  else {
    local_6d0.m_accept_time = GetTime();
    local_6d0.m_bypass_limits = false;
    local_6d0.m_coins_to_uncache =
         (vector<COutPoint,_std::allocator<COutPoint>_> *)&stack0xfffffffffffff8a8;
    local_6d0.m_test_accept = false;
    local_6d0.m_allow_replacement = true;
    local_6d0.m_allow_sibling_eviction = false;
    local_6d0.m_package_submission = true;
    local_6d0.m_package_feerates = true;
    local_6d0.m_client_maxfeerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._M_payload._M_value.nSatoshisPerK =
         *(CFeeRate *)
          &(client_maxfeerate->super__Optional_base<CFeeRate,_true,_true>)._M_payload.
           super__Optional_payload_base<CFeeRate>._M_payload;
    local_6d0.m_client_maxfeerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._M_engaged =
         (client_maxfeerate->super__Optional_base<CFeeRate,_true,_true>)._M_payload.
         super__Optional_payload_base<CFeeRate>._M_engaged;
    local_6d0.m_client_maxfeerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._9_7_ =
         *(undefined7 *)
          &(client_maxfeerate->super__Optional_base<CFeeRate,_true,_true>)._M_payload.
           super__Optional_payload_base<CFeeRate>.field_0x9;
    local_6d0.m_allow_carveouts = false;
    local_6d0.m_chainparams = pCVar2;
    anon_unknown.dwarf_12ac559::MemPoolAccept::MemPoolAccept
              ((MemPoolAccept *)local_680,pool,active_chainstate);
    local_78._M_p = (pointer)&local_68;
    local_80 = (element_type *)0x0;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_58._M_p = (pointer)&local_48;
    local_50 = (pointer)0x0;
    local_48._M_local_buf[0] = '\0';
    bVar9 = IsWellFormedPackage(package,(PackageValidationState *)&local_80,true);
    if (bVar9) {
      bVar9 = IsChildWithParents(package);
      if (!bVar9) {
        local_248[0] = '\x1e';
        local_248[1] = '\0';
        local_248[2] = '\0';
        local_248[3] = '\0';
        local_248[4] = '\0';
        local_248[5] = '\0';
        local_248[6] = '\0';
        local_248[7] = '\0';
        local_1c8 = (undefined1  [8])local_1b8;
        pcVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1c8,(size_type *)local_248,0);
        local_1c8._0_4_ = SUB84(pcVar11,0);
        local_1c8._4_4_ = (undefined4)((ulong)pcVar11 >> 0x20);
        puVar14 = local_248 + 0x10;
        local_1b8._0_4_ = (undefined4)CONCAT71(local_248._1_7_,local_248[0]);
        local_1b8._4_4_ = SUB74(local_248._1_7_,3);
        builtin_strncpy(pcVar11,"package-not-child-with-parents",0x1e);
        pcVar11[CONCAT71(local_248._1_7_,local_248[0])] = '\0';
        local_248[0] = SUB81(puVar14,0);
        local_248._1_7_ = (undefined7)((ulong)puVar14 >> 8);
        local_248[8] = _S_red;
        local_248._9_7_ = 0;
        local_248[0x10] = '\0';
        auStack_1c0._0_4_ = local_1b8._0_4_;
        auStack_1c0._4_4_ = local_1b8._4_4_;
        ValidationState<PackageValidationResult>::Invalid
                  ((ValidationState<PackageValidationResult> *)&local_80,PCKG_POLICY,
                   (string *)local_1c8,(string *)local_248);
        if ((undefined1 *)CONCAT71(local_248._1_7_,local_248[0]) != puVar14) {
          operator_delete((undefined1 *)CONCAT71(local_248._1_7_,local_248[0]),
                          CONCAT71(local_248._17_7_,local_248[0x10]) + 1);
        }
        if ((CChainParams *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != (CChainParams *)local_1b8)
        {
          operator_delete((CChainParams *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_),
                          CONCAT44(local_1b8._4_4_,local_1b8._0_4_) + 1);
        }
        local_1c8._0_4_ = SUB84(local_80,0);
        local_1c8._4_4_ = (undefined4)((ulong)local_80 >> 0x20);
        auStack_1c0 = (undefined1  [8])(local_1b8 + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)auStack_1c0,local_78._M_p,local_78._M_p + local_70);
        local_1a8._8_8_ = &local_190;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_1a8 + 8),local_58._M_p,local_50 + (long)local_58._M_p);
        local_248[0] = false;
        local_248[1] = '\0';
        local_248[2] = '\0';
        local_248[3] = '\0';
        local_248[4] = '\0';
        local_248[5] = '\0';
        local_248[6] = '\0';
        local_248[7] = '\0';
        local_248[8] = _S_red;
        local_248._9_7_ = 0;
        local_248[0x10] = '\0';
        local_248._17_7_ = 0;
        aStack_230._M_local_buf[0] = (char)(local_248 + 8);
        aStack_230._1_7_ = (undefined7)((ulong)(local_248 + 8) >> 8);
        local_220._M_p = (pointer)0x0;
        state_00.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)in_stack_fffffffffffff870;
        state_00.super_ValidationState<PackageValidationResult>.m_mode =
             (int)in_stack_fffffffffffff868;
        state_00.super_ValidationState<PackageValidationResult>.m_result =
             (int)((ulong)in_stack_fffffffffffff868 >> 0x20);
        state_00.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
             (size_type)package;
        state_00.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = in_stack_fffffffffffff880;
        state_00.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_local_buf
        [8] = in_stack_fffffffffffff888;
        state_00.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._9_7_ =
             in_stack_fffffffffffff889;
        state_00.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)in_stack_fffffffffffff890;
        state_00.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
             (size_type)in_stack_fffffffffffff898;
        state_00.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = in_stack_fffffffffffff8a0;
        state_00.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ = hash
        ;
        aStack_230._M_local_buf[8] = aStack_230._M_local_buf[0];
        aStack_230._9_7_ = aStack_230._1_7_;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  (__return_storage_ptr__,state_00,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)local_1c8);
        goto LAB_003f6fc0;
      }
      psVar19 = (package->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)((long)psVar19 -
                 (long)(package->
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) < 0x11) {
        __assert_fail("package.size() > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0x6a7,
                      "PackageMempoolAcceptResult (anonymous namespace)::MemPoolAccept::AcceptPackage(const Package &, ATMPArgs &)"
                     );
      }
      SaltedTxidHasher::SaltedTxidHasher((SaltedTxidHasher *)&local_718);
      local_718._M_buckets = &local_718._M_single_bucket;
      local_718._M_bucket_count = 1;
      local_718._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_718._M_element_count = 0;
      local_718._M_rehash_policy._M_max_load_factor = 1.0;
      local_718._M_rehash_policy._M_next_resize = 0;
      local_718._M_single_bucket = (__node_base_ptr)0x0;
      psVar26 = (package->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      psVar28 = (package->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_finish + -1;
      if (psVar26 != psVar28) {
        do {
          peVar3 = (psVar26->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          local_1c8._0_4_ =
               *(undefined4 *)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          local_1c8._4_4_ =
               *(undefined4 *)
                ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 4);
          auStack_1c0._0_4_ =
               *(undefined4 *)
                ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          auStack_1c0._4_4_ =
               *(undefined4 *)
                ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0xc);
          local_1b8._0_4_ =
               *(undefined4 *)
                ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          puVar4 = (uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            0x14);
          local_1b8[4] = puVar4[0];
          local_1b8[5] = puVar4[1];
          local_1b8[6] = puVar4[2];
          local_1b8[7] = puVar4[3];
          local_1b8._8_4_ =
               *(undefined4 *)
                ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
          local_1b8._12_4_ =
               *(undefined4 *)
                ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x1c);
          local_248[0] = SUB81(&local_718,0);
          local_248._1_7_ = (undefined7)((ulong)&local_718 >> 8);
          std::
          _Hashtable<uint256,uint256,std::allocator<uint256>,std::__detail::_Identity,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<uint256_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<uint256,true>>>>
                    ((_Hashtable<uint256,uint256,std::allocator<uint256>,std::__detail::_Identity,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&local_718,local_1c8,local_248);
          psVar26 = psVar26 + 1;
        } while (psVar26 != psVar28);
      }
      pCVar18 = Chainstate::CoinsTip(local_400);
      peVar3 = psVar19[-1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      pCVar20 = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar27 = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (pCVar20 != pCVar27) {
        do {
          bVar9 = CCoinsViewCache::HaveCoinInCache(pCVar18,&pCVar20->prevout);
          if (!bVar9) {
            if (pCStack_750 == (COutPoint *)0x0) {
              std::vector<COutPoint,std::allocator<COutPoint>>::_M_realloc_insert<COutPoint_const&>
                        ((vector<COutPoint,std::allocator<COutPoint>> *)&stack0xfffffffffffff8a8,
                         (iterator)0x0,&pCVar20->prevout);
            }
            else {
              pCStack_750->n = (pCVar20->prevout).n;
              uVar5 = *(undefined8 *)
                       (pCVar20->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems;
              uVar6 = *(undefined8 *)
                       ((pCVar20->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
              ;
              uVar7 = *(undefined8 *)
                       ((pCVar20->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                       0x18);
              *(undefined8 *)
               ((pCStack_750->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
                   *(undefined8 *)
                    ((pCVar20->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)
              ;
              *(undefined8 *)
               ((pCStack_750->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar7;
              *(undefined8 *)(pCStack_750->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems =
                   uVar5;
              *(undefined8 *)
               ((pCStack_750->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar6;
              pCStack_750 = pCStack_750 + 1;
            }
          }
          pCVar20 = pCVar20 + 1;
        } while (pCVar20 != pCVar27);
      }
      pCVar18 = Chainstate::CoinsTip(local_400);
      CCoinsViewBacked::SetBackend((CCoinsViewBacked *)(local_680 + 8),(CCoinsView *)pCVar18);
      peVar3 = psVar19[-1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      pCVar20 = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar27 = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
      lVar21 = (long)pCVar27 - (long)pCVar20;
      lVar29 = (lVar21 >> 3) * 0x4ec4ec4ec4ec4ec5 >> 2;
      if (0 < lVar29) {
        lVar29 = lVar29 + 1;
        do {
          bVar9 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                                *)local_680,(CTxIn *)&local_718);
          pCVar25 = pCVar20;
          __args_00 = pCVar27;
          pPVar31 = __return_storage_ptr__;
          if (bVar9) goto LAB_003f706c;
          bVar9 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                                *)local_680,(CTxIn *)&local_718);
          pCVar25 = pCVar20 + 1;
          __args_00 = pCVar27;
          pPVar31 = __return_storage_ptr__;
          if (bVar9) goto LAB_003f706c;
          bVar9 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                                *)local_680,(CTxIn *)&local_718);
          pCVar25 = pCVar20 + 2;
          __args_00 = pCVar27;
          pPVar31 = __return_storage_ptr__;
          if (bVar9) goto LAB_003f706c;
          bVar9 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                                *)local_680,(CTxIn *)&local_718);
          pCVar25 = pCVar20 + 3;
          __args_00 = pCVar27;
          pPVar31 = __return_storage_ptr__;
          if (bVar9) goto LAB_003f706c;
          pCVar20 = pCVar20 + 4;
          lVar29 = lVar29 + -1;
          lVar21 = lVar21 + -0x1a0;
        } while (1 < lVar29);
      }
      lVar21 = (lVar21 >> 3) * 0x4ec4ec4ec4ec4ec5;
      __args_00 = pCVar27;
      pPVar31 = __return_storage_ptr__;
      if (lVar21 == 1) {
LAB_003f704b:
        bVar9 = __gnu_cxx::__ops::
                _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
                ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                              *)local_680,(CTxIn *)&local_718);
        pCVar25 = pCVar20;
        if (!bVar9) {
          pCVar25 = pCVar27;
        }
LAB_003f706c:
        if (pCVar25 == pCVar27) goto LAB_003f7241;
        local_248[0] = '*';
        local_248[1] = '\0';
        local_248[2] = '\0';
        local_248[3] = '\0';
        local_248[4] = '\0';
        local_248[5] = '\0';
        local_248[6] = '\0';
        local_248[7] = '\0';
        local_1c8 = (undefined1  [8])local_1b8;
        pcVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1c8,(size_type *)local_248,0);
        local_1c8._0_4_ = SUB84(pcVar11,0);
        local_1c8._4_4_ = (undefined4)((ulong)pcVar11 >> 0x20);
        puVar14 = local_248 + 0x10;
        local_1b8._0_4_ = (undefined4)CONCAT71(local_248._1_7_,local_248[0]);
        local_1b8._4_4_ = SUB74(local_248._1_7_,3);
        builtin_strncpy(pcVar11,"package-not-child-with-unconfirmed-parents",0x2a);
        pcVar11[CONCAT71(local_248._1_7_,local_248[0])] = '\0';
        local_248[0] = SUB81(puVar14,0);
        local_248._1_7_ = (undefined7)((ulong)puVar14 >> 8);
        local_248[8] = _S_red;
        local_248._9_7_ = 0;
        local_248[0x10] = '\0';
        auStack_1c0._0_4_ = local_1b8._0_4_;
        auStack_1c0._4_4_ = local_1b8._4_4_;
        ValidationState<PackageValidationResult>::Invalid
                  ((ValidationState<PackageValidationResult> *)&local_80,PCKG_POLICY,
                   (string *)local_1c8,(string *)local_248);
        if ((undefined1 *)CONCAT71(local_248._1_7_,local_248[0]) != puVar14) {
          operator_delete((undefined1 *)CONCAT71(local_248._1_7_,local_248[0]),
                          CONCAT71(local_248._17_7_,local_248[0x10]) + 1);
        }
        pCVar32 = active_chainstate;
        if ((CChainParams *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != (CChainParams *)local_1b8)
        {
          operator_delete((CChainParams *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_),
                          CONCAT44(local_1b8._4_4_,local_1b8._0_4_) + 1);
        }
        local_1c8._0_4_ = SUB84(local_80,0);
        local_1c8._4_4_ = (undefined4)((ulong)local_80 >> 0x20);
        auStack_1c0 = (undefined1  [8])(local_1b8 + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)auStack_1c0,local_78._M_p,local_78._M_p + local_70);
        local_1a8._8_8_ = &local_190;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_1a8 + 8),local_58._M_p,local_50 + (long)local_58._M_p);
        local_248[0] = false;
        local_248[1] = '\0';
        local_248[2] = '\0';
        local_248[3] = '\0';
        local_248[4] = '\0';
        local_248[5] = '\0';
        local_248[6] = '\0';
        local_248[7] = '\0';
        local_248[8] = _S_red;
        local_248._9_7_ = 0;
        local_248[0x10] = '\0';
        local_248._17_7_ = 0;
        aStack_230._M_local_buf[0] = (char)(local_248 + 8);
        aStack_230._1_7_ = (undefined7)((ulong)(local_248 + 8) >> 8);
        local_220._M_p = (pointer)0x0;
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)__args_00;
        state_01.super_ValidationState<PackageValidationResult>.m_mode =
             (int)in_stack_fffffffffffff868;
        state_01.super_ValidationState<PackageValidationResult>.m_result =
             (int)((ulong)in_stack_fffffffffffff868 >> 0x20);
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
             (size_type)package;
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)pPVar31;
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_local_buf
        [8] = in_stack_fffffffffffff888;
        state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._9_7_ =
             in_stack_fffffffffffff889;
        state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)pCVar32;
        state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
             (size_type)in_stack_fffffffffffff898;
        state_01.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = in_stack_fffffffffffff8a0;
        state_01.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ = hash
        ;
        aStack_230._M_local_buf[8] = aStack_230._M_local_buf[0];
        aStack_230._9_7_ = aStack_230._1_7_;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  (__return_storage_ptr__,state_01,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)local_1c8);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                     *)local_248);
        if ((_Base_ptr *)local_1a8._8_8_ != &local_190) {
          operator_delete((void *)local_1a8._8_8_,(ulong)((long)&local_190->_M_color + 1));
        }
        if (auStack_1c0 != (undefined1  [8])(local_1b8 + 8)) {
          operator_delete((void *)auStack_1c0,CONCAT44(local_1b8._12_4_,local_1b8._8_4_) + 1);
        }
      }
      else {
        if (lVar21 == 2) {
LAB_003f7024:
          __args_00 = pCVar27;
          bVar9 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                                *)local_680,(CTxIn *)&local_718);
          pCVar25 = pCVar20;
          if (!bVar9) {
            pCVar20 = pCVar20 + 1;
            goto LAB_003f704b;
          }
          goto LAB_003f706c;
        }
        if (lVar21 == 3) {
          bVar9 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::$_1>
                  ::operator()((_Iter_negate<(anonymous_namespace)::MemPoolAccept::AcceptPackage(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                                *)local_680,(CTxIn *)&local_718);
          pCVar25 = pCVar20;
          __args_00 = pCVar27;
          if (!bVar9) {
            pCVar20 = pCVar20 + 1;
            goto LAB_003f7024;
          }
          goto LAB_003f706c;
        }
LAB_003f7241:
        __return_storage_ptr__ = pPVar31;
        CCoinsViewBacked::SetBackend((CCoinsViewBacked *)(local_680 + 8),&local_408);
        local_690._M_device = (mutex_type *)(local_680._0_8_ + 0x58);
        local_690._M_owns = false;
        std::unique_lock<std::recursive_mutex>::lock(&local_690);
        local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_b0._M_impl.super__Rb_tree_header._M_header;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_e0._M_impl.super__Rb_tree_header._M_header;
        local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_738.
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_738.
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_738.
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        __x = (package->
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
        pvVar33 = (package->
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
        if (__x == pvVar33) {
LAB_003f7996:
          local_290 = (undefined1  [8])local_80;
          local_288._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_280 + 8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_288,local_78._M_p,local_78._M_p + local_70);
          local_268[0] = (pointer)local_258;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_268,local_58._M_p,local_50 + (long)local_58._M_p);
          local_1b8._8_8_ = auStack_1c0;
          local_1c8._0_4_ = VALID;
          local_1c8[4] = '\0';
          local_1c8[5] = '\0';
          local_1c8[6] = '\0';
          local_1c8[7] = '\0';
          auStack_1c0._0_4_ = _S_red;
          auStack_1c0._4_4_ = TX_RESULT_UNSET;
          local_1b8[0] = '\0';
          local_1b8[1] = '\0';
          local_1b8[2] = '\0';
          local_1b8[3] = '\0';
          local_1b8[4] = '\0';
          local_1b8[5] = '\0';
          local_1b8[6] = '\0';
          local_1b8[7] = '\0';
          local_1a8[0] = (undefined1)local_1b8._8_8_;
          local_1a8._1_4_ = (undefined4)((ulong)local_1b8._8_8_ >> 8);
          local_1a8._5_3_ = (undefined3)((ulong)local_1b8._8_8_ >> 0x28);
          local_1a8._8_8_ = (_Storage<CFeeRate,_true>)0x0;
          state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
               (pointer)__args_00;
          state_02.super_ValidationState<PackageValidationResult>.m_mode =
               (int)in_stack_fffffffffffff868;
          state_02.super_ValidationState<PackageValidationResult>.m_result =
               (int)((ulong)in_stack_fffffffffffff868 >> 0x20);
          state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
               (size_type)package;
          state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity = (size_type)__return_storage_ptr__;
          state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
          _M_local_buf[8] = in_stack_fffffffffffff888;
          state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._9_7_ =
               in_stack_fffffffffffff889;
          state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
               (pointer)active_chainstate;
          state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
               (size_type)in_stack_fffffffffffff898;
          state_02.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity = (size_type)pvVar33;
          state_02.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
               hash;
          PackageMempoolAcceptResult::PackageMempoolAcceptResult
                    ((PackageMempoolAcceptResult *)local_248,state_02,
                     (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                      *)local_290);
          std::
          _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
          ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                       *)local_1c8);
          if (local_268[0] != (pointer)local_258) {
            operator_delete(local_268[0],(ulong)((long)(CAmount *)local_258._0_8_ + 1));
          }
          if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_280 + 8)) {
            operator_delete(local_288._M_pi,(ulong)(local_280._8_8_ + 1));
          }
        }
        else {
          in_stack_fffffffffffff888 = 0;
          in_stack_fffffffffffff889 = 0;
          do {
            peVar3 = (__x->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            uVar5 = *(undefined8 *)
                     (peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
            uVar6 = *(undefined8 *)
                     ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                     + 8);
            uVar7 = *(undefined8 *)
                     ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                     + 0x10);
            uVar8 = *(undefined8 *)
                     ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                     + 0x18);
            local_1b8._1_3_ = (undefined3)uVar7;
            local_1b8._4_4_ = (undefined4)((ulong)uVar7 >> 0x18);
            local_1b8[8] = (undefined1)((ulong)uVar7 >> 0x38);
            local_1b8._9_3_ = (undefined3)uVar8;
            local_1b8._12_4_ = (undefined4)((ulong)uVar8 >> 0x18);
            local_1a8[0] = (undefined1)((ulong)uVar8 >> 0x38);
            local_1c8._1_3_ = (undefined3)uVar5;
            local_1c8[0] = 1;
            local_1c8._4_4_ = (undefined4)((ulong)uVar5 >> 0x18);
            auStack_1c0[0] = SUB81((ulong)uVar5 >> 0x38,0);
            auStack_1c0._1_3_ = (undefined3)uVar6;
            auStack_1c0._4_4_ = (undefined4)((ulong)uVar6 >> 0x18);
            local_1b8[0] = (undefined1)((ulong)uVar6 >> 0x38);
            bVar9 = CTxMemPool::exists((CTxMemPool *)local_680._0_8_,(GenTxid *)local_1c8);
            __args_00 = (pointer)&peVar3->m_witness_hash;
            txid = &peVar3->hash;
            if (bVar9) {
              pCVar12 = CTxMemPool::GetEntry((CTxMemPool *)local_680._0_8_,txid);
              local_1c8._0_4_ = SUB84(pCVar12,0);
              local_1c8._4_4_ = (undefined4)((ulong)pCVar12 >> 0x20);
              ppCVar13 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                                   ((CTxMemPoolEntry **)local_1c8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                                    ,0x6e4,"AcceptPackage","m_pool.GetEntry(txid)");
              pCVar12 = *ppCVar13;
              iVar10 = GetVirtualTransactionSize
                                 ((long)pCVar12->nTxWeight,pCVar12->sigOpCost,nBytesPerSigOp);
              local_178._M_right = (_Base_ptr)(long)(int)iVar10;
              local_150 = (_Storage<long,_true>)pCVar12->nFee;
              local_1c8._0_4_ = MEMPOOL_ENTRY;
              auStack_1c0._0_4_ = _S_red;
              auStack_1c0._4_4_ = TX_RESULT_UNSET;
              local_1b8._0_8_ = local_1a8;
              local_1b8[8] = '\0';
              local_1b8[9] = '\0';
              local_1b8[10] = '\0';
              local_1b8[0xb] = '\0';
              local_1b8[0xc] = '\0';
              local_1b8[0xd] = '\0';
              local_1b8[0xe] = '\0';
              local_1b8[0xf] = '\0';
              local_1a8[0] = false;
              local_198._M_p = local_188;
              local_190 = (_Base_ptr)0x0;
              local_188[0] = _S_red;
              local_178._0_8_ = &local_178;
              local_178._M_left = (_Base_ptr)0x0;
              local_158 = true;
              local_148 = true;
              local_138 = false;
              local_118 = false;
              local_f0 = false;
              local_178._M_parent = (_Base_ptr)local_178._0_8_;
              std::
              _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
              ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                        ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                          *)&local_b0,(transaction_identifier<true> *)__args_00,
                         (MempoolAcceptResult *)local_1c8);
              if ((local_118 == true) &&
                 (local_118 = false,
                 local_130._M_value.
                 super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                operator_delete(local_130._M_value.
                                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_130._M_value.
                                      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                local_130._0_8_);
              }
              std::__cxx11::
              _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          *)&local_178);
              if (local_198._M_p != local_188) {
                operator_delete(local_198._M_p,CONCAT71(local_188._1_7_,local_188[0]) + 1);
              }
              in_stack_fffffffffffff898 = __x;
              if ((_Base_ptr)local_1b8._0_8_ != (_Base_ptr)local_1a8) {
                operator_delete((void *)local_1b8._0_8_,
                                CONCAT35(local_1a8._5_3_,CONCAT41(local_1a8._1_4_,local_1a8[0])) + 1
                               );
                in_stack_fffffffffffff898 = __x;
              }
            }
            else {
              uVar5 = *(undefined8 *)(txid->m_wrapped).super_base_blob<256U>.m_data._M_elems;
              uVar6 = *(undefined8 *)
                       ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar7 = *(undefined8 *)
                       ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)
              ;
              uVar8 = *(undefined8 *)
                       ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18)
              ;
              local_1b8._1_3_ = (undefined3)uVar7;
              local_1b8._4_4_ = (undefined4)((ulong)uVar7 >> 0x18);
              local_1b8[8] = (undefined1)((ulong)uVar7 >> 0x38);
              local_1b8._9_3_ = (undefined3)uVar8;
              local_1b8._12_4_ = (undefined4)((ulong)uVar8 >> 0x18);
              local_1a8[0] = (undefined1)((ulong)uVar8 >> 0x38);
              local_1c8._1_3_ = (undefined3)uVar5;
              local_1c8._0_4_ = (uint)(uint3)local_1c8._1_3_ << 8;
              local_1c8._4_4_ = (undefined4)((ulong)uVar5 >> 0x18);
              auStack_1c0[0] = SUB81((ulong)uVar5 >> 0x38,0);
              auStack_1c0._1_3_ = (undefined3)uVar6;
              auStack_1c0._4_4_ = (undefined4)((ulong)uVar6 >> 0x18);
              local_1b8[0] = (undefined1)((ulong)uVar6 >> 0x38);
              bVar9 = CTxMemPool::exists((CTxMemPool *)local_680._0_8_,(GenTxid *)local_1c8);
              if (bVar9) {
                pCVar12 = CTxMemPool::GetEntry((CTxMemPool *)local_680._0_8_,txid);
                local_1c8._0_4_ = SUB84(pCVar12,0);
                local_1c8._4_4_ = (undefined4)((ulong)pCVar12 >> 0x20);
                ppCVar13 = inline_assertion_check<true,CTxMemPoolEntry_const*>
                                     ((CTxMemPoolEntry **)local_1c8,
                                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                                      ,0x6ee,"AcceptPackage","m_pool.GetEntry(txid)");
                peVar3 = ((*ppCVar13)->tx).
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_1c8._0_4_ = DIFFERENT_WITNESS;
                auStack_1c0._0_4_ = _S_red;
                auStack_1c0._4_4_ = TX_RESULT_UNSET;
                local_1b8._0_8_ = local_1a8;
                local_1b8[8] = '\0';
                local_1b8[9] = '\0';
                local_1b8[10] = '\0';
                local_1b8[0xb] = '\0';
                local_1b8[0xc] = '\0';
                local_1b8[0xd] = '\0';
                local_1b8[0xe] = '\0';
                local_1b8[0xf] = '\0';
                local_1a8[0] = false;
                local_198._M_p = local_188;
                local_190 = (_Base_ptr)0x0;
                local_188[0] = _S_red;
                local_178._0_8_ = &local_178;
                local_178._M_left = (_Base_ptr)0x0;
                local_158 = false;
                local_148 = false;
                local_138 = false;
                local_118 = false;
                local_110._0_8_ =
                     *(undefined8 *)
                      (peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                local_110._8_8_ =
                     *(undefined8 *)
                      ((long)&(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data + 8);
                local_110._16_8_ =
                     *(undefined8 *)
                      ((long)&(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data + 0x10
                      );
                local_110._24_8_ =
                     *(undefined8 *)
                      ((long)&(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data + 0x18
                      );
                local_f0 = true;
                local_178._M_parent = (_Base_ptr)local_178._0_8_;
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&local_b0,(transaction_identifier<true> *)__args_00,
                           (MempoolAcceptResult *)local_1c8);
                if ((local_118 == true) &&
                   (local_118 = false,
                   local_130._M_value.
                   super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                  operator_delete(local_130._M_value.
                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_130._M_value.
                                        super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  local_130._0_8_);
                }
                std::__cxx11::
                _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)&local_178);
                p_Var23 = (_Base_ptr)local_1b8._0_8_;
                if (local_198._M_p != local_188) {
                  operator_delete(local_198._M_p,CONCAT71(local_188._1_7_,local_188[0]) + 1);
                  p_Var23 = (_Base_ptr)local_1b8._0_8_;
                }
                local_1b8._0_8_ = p_Var23;
                if (p_Var23 != (_Base_ptr)local_1a8) {
                  lVar21 = CONCAT35(local_1a8._5_3_,CONCAT41(local_1a8._1_4_,local_1a8[0]));
LAB_003f7945:
                  operator_delete(p_Var23,lVar21 + 1);
                }
              }
              else {
                local_290 = (undefined1  [8])
                            (__x->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr;
                local_288._M_pi =
                     (__x->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
                if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
                  }
                }
                __l._M_len = 1;
                __l._M_array = (iterator)local_290;
                std::
                vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          *)local_248,__l,(allocator_type *)&local_2d8);
                anon_unknown.dwarf_12ac559::MemPoolAccept::AcceptSubPackage
                          ((PackageMempoolAcceptResult *)local_1c8,(MemPoolAccept *)local_680,
                           (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)local_248,&local_6d0);
                std::
                vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           *)local_248);
                if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288._M_pi);
                }
                pmVar16 = std::
                          map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                          ::at((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                                *)(local_188 + 8),(key_type *)__args_00);
                if (pmVar16->m_result_type == VALID) {
                  local_248[0] = true;
                  uVar5 = *(undefined8 *)
                           (((base_blob<256U> *)&(__args_00->prevout).hash)->m_data)._M_elems;
                  uVar6 = *(undefined8 *)
                           ((((base_blob<256U> *)&(__args_00->prevout).hash)->m_data)._M_elems + 8);
                  uVar7 = *(undefined8 *)
                           ((((base_blob<256U> *)&(__args_00->prevout).hash)->m_data)._M_elems +
                           0x10);
                  uVar8 = *(undefined8 *)
                           ((((base_blob<256U> *)&(__args_00->prevout).hash)->m_data)._M_elems +
                           0x18);
                  local_248._17_7_ = (undefined7)uVar7;
                  aStack_230._M_local_buf[0] = (char)((ulong)uVar7 >> 0x38);
                  aStack_230._1_7_ = (undefined7)uVar8;
                  aStack_230._M_local_buf[8] = (char)((ulong)uVar8 >> 0x38);
                  local_248._1_7_ = (undefined7)uVar5;
                  local_248[8] = (undefined1)((ulong)uVar5 >> 0x38);
                  local_248._9_7_ = (undefined7)uVar6;
                  local_248[0x10] = (undefined1)((ulong)uVar6 >> 0x38);
                  bVar9 = CTxMemPool::exists((CTxMemPool *)local_680._0_8_,(GenTxid *)local_248);
                  if (!bVar9) {
                    __assert_fail("m_pool.exists(GenTxid::Wtxid(wtxid))",
                                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                                  ,0x6f9,
                                  "PackageMempoolAcceptResult (anonymous namespace)::MemPoolAccept::AcceptPackage(const Package &, ATMPArgs &)"
                                 );
                  }
                  std::
                  _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                  ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult_const&>
                            ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                              *)&local_b0,(transaction_identifier<true> *)__args_00,pmVar16);
                }
                else {
                  TVar1 = (pmVar16->m_state).super_ValidationState<TxValidationResult>.m_result;
                  if ((TVar1 == TX_MISSING_INPUTS) || (TVar1 == TX_RECONSIDERABLE)) {
                    std::
                    _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                    ::
                    _M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult_const&>
                              ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                                *)&local_e0,(transaction_identifier<true> *)__args_00,pmVar16);
                    std::
                    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ::push_back(&local_738,__x);
                  }
                  else {
                    local_248[0] = SUB81(local_248 + 0x10,0);
                    local_248._1_7_ = (undefined7)((ulong)(local_248 + 0x10) >> 8);
                    local_290 = (undefined1  [8])0x12;
                    pcVar11 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_248,(size_type *)local_290,0);
                    local_248[0] = SUB81(pcVar11,0);
                    local_248._1_7_ = (undefined7)((ulong)pcVar11 >> 8);
                    local_248[0x10] = local_290[0];
                    local_248._17_7_ = local_290._1_7_;
                    builtin_strncpy(pcVar11,"transaction failed",0x12);
                    pcVar11[(long)local_290] = '\0';
                    local_288._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    local_280[0] = '\0';
                    local_290 = (undefined1  [8])local_280;
                    local_248[8] = local_248[0x10];
                    local_248._9_7_ = local_248._17_7_;
                    ValidationState<PackageValidationResult>::Invalid
                              ((ValidationState<PackageValidationResult> *)&local_80,PCKG_TX,
                               (string *)local_248,(string *)local_290);
                    if (local_290 != (undefined1  [8])local_280) {
                      operator_delete((void *)local_290,CONCAT71(local_280._1_7_,local_280[0]) + 1);
                    }
                    puVar14 = local_248 + 0x10;
                    if ((undefined1 *)CONCAT71(local_248._1_7_,local_248[0]) != puVar14) {
                      operator_delete((undefined1 *)CONCAT71(local_248._1_7_,local_248[0]),
                                      CONCAT71(local_248._17_7_,local_248[0x10]) + 1);
                      puVar14 = extraout_RAX;
                    }
                    in_stack_fffffffffffff889 = (undefined7)((ulong)puVar14 >> 8);
                    in_stack_fffffffffffff888 = 1;
                    std::
                    _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                    ::
                    _M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult_const&>
                              ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                                *)&local_e0,(transaction_identifier<true> *)__args_00,pmVar16);
                  }
                }
                std::
                _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                             *)(local_188 + 8));
                if ((_Base_ptr *)local_1a8._8_8_ != &local_190) {
                  operator_delete((void *)local_1a8._8_8_,(ulong)((long)&local_190->_M_color + 1));
                }
                p_Var23 = (_Base_ptr)CONCAT44(auStack_1c0._4_4_,auStack_1c0._0_4_);
                if (p_Var23 != (_Base_ptr)(local_1b8 + 8)) {
                  lVar21 = CONCAT44(local_1b8._12_4_,local_1b8._8_4_);
                  goto LAB_003f7945;
                }
              }
            }
            __x = __x + 1;
          } while (__x != pvVar33);
          if (((in_stack_fffffffffffff888 & 1) != 0) ||
             (local_738.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_738.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_003f7996;
          anon_unknown.dwarf_12ac559::MemPoolAccept::AcceptSubPackage
                    ((PackageMempoolAcceptResult *)local_248,(MemPoolAccept *)local_680,&local_738,
                     &local_6d0);
        }
        uVar5 = local_680._0_8_;
        pCVar18 = Chainstate::CoinsTip(local_400);
        LimitMempoolSize((CTxMemPool *)uVar5,pCVar18);
        pCVar20 = (pointer)(package->
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
        pCVar27 = (pointer)(package->
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
        if (pCVar20 != pCVar27) {
          __args_00 = pCVar27;
          do {
            peVar3 = *(element_type **)
                      &(pCVar20->prevout).hash.m_wrapped.super_base_blob<256U>.m_data;
            __args = &peVar3->m_witness_hash;
            cVar15 = std::
                     _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                     ::find(&local_200,&__args->m_wrapped);
            if ((_Rb_tree_header *)cVar15._M_node == &local_200._M_impl.super__Rb_tree_header) {
              iVar17 = std::
                       _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                       ::find(&local_b0,&__args->m_wrapped);
              if ((_Rb_tree_header *)iVar17._M_node == &local_b0._M_impl.super__Rb_tree_header) {
                iVar17 = std::
                         _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                         ::find(&local_e0,&__args->m_wrapped);
                if ((_Rb_tree_header *)iVar17._M_node != &local_e0._M_impl.super__Rb_tree_header) {
                  std::
                  _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                  ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult&>
                            ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                              *)&local_b0,__args,(MempoolAcceptResult *)(iVar17._M_node + 2));
                }
              }
              else {
                std::
                _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                ::find(&local_e0,&__args->m_wrapped);
                peVar3 = *(element_type **)
                          &(pCVar20->prevout).hash.m_wrapped.super_base_blob<256U>.m_data;
                uVar5 = *(undefined8 *)&(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data;
                uVar6 = *(undefined8 *)((long)&(peVar3->hash).m_wrapped.super_base_blob<256U> + 8);
                uVar7 = *(undefined8 *)
                         ((long)&(peVar3->hash).m_wrapped.super_base_blob<256U> + 0x10);
                uVar8 = *(undefined8 *)
                         ((long)&(peVar3->hash).m_wrapped.super_base_blob<256U> + 0x18);
                local_1b8._1_3_ = (undefined3)uVar7;
                local_1b8._4_4_ = (undefined4)((ulong)uVar7 >> 0x18);
                local_1b8[8] = (undefined1)((ulong)uVar7 >> 0x38);
                local_1b8._9_3_ = (undefined3)uVar8;
                local_1b8._12_4_ = (undefined4)((ulong)uVar8 >> 0x18);
                local_1a8[0] = (undefined1)((ulong)uVar8 >> 0x38);
                local_1c8._1_3_ = (undefined3)uVar5;
                local_1c8._0_4_ = (uint)(uint3)local_1c8._1_3_ << 8;
                local_1c8._4_4_ = (undefined4)((ulong)uVar5 >> 0x18);
                auStack_1c0[0] = SUB81((ulong)uVar5 >> 0x38,0);
                auStack_1c0._1_3_ = (undefined3)uVar6;
                auStack_1c0._4_4_ = (undefined4)((ulong)uVar6 >> 0x18);
                local_1b8[0] = (undefined1)((ulong)uVar6 >> 0x38);
                bVar9 = CTxMemPool::exists((CTxMemPool *)local_680._0_8_,(GenTxid *)local_1c8);
                if (!bVar9) {
                  local_1c8 = (undefined1  [8])local_1b8;
                  local_2d8.m_mode = 0x12;
                  local_2d8.m_result = TX_RESULT_UNSET;
                  pcVar11 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_1c8,(size_type *)&local_2d8,0);
                  local_1c8._0_4_ = SUB84(pcVar11,0);
                  local_1c8._4_4_ = (undefined4)((ulong)pcVar11 >> 0x20);
                  local_1b8._0_4_ = local_2d8.m_mode;
                  local_1b8._4_4_ = local_2d8.m_result;
                  builtin_strncpy(pcVar11,"transaction failed",0x12);
                  pcVar11[local_2d8._0_8_] = '\0';
                  local_2d8.m_reject_reason._M_dataplus._M_p = (pointer)0x0;
                  local_2d8.m_reject_reason._M_string_length =
                       local_2d8.m_reject_reason._M_string_length & 0xffffffffffffff00;
                  pCVar27 = __args_00;
                  local_2d8._0_8_ = (void *)((long)&local_2d8 + 0x10U);
                  auStack_1c0._0_4_ = local_1b8._0_4_;
                  auStack_1c0._4_4_ = local_1b8._4_4_;
                  ValidationState<PackageValidationResult>::Invalid
                            ((ValidationState<PackageValidationResult> *)local_248,PCKG_TX,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1c8,(string *)&local_2d8);
                  __args_00 = pCVar27;
                  if ((void *)local_2d8._0_8_ != (void *)((long)&local_2d8 + 0x10U)) {
                    operator_delete((void *)local_2d8._0_8_,
                                    local_2d8.m_reject_reason._M_string_length + 1);
                  }
                  if ((undefined1 *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != local_1b8) {
                    operator_delete((undefined1 *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_),
                                    CONCAT44(local_1b8._4_4_,local_1b8._0_4_) + 1);
                  }
                  local_2d8.m_mode = M_VALID;
                  local_2d8.m_result = TX_RESULT_UNSET;
                  local_2d8.m_reject_reason._M_dataplus._M_p =
                       (pointer)&local_2d8.m_reject_reason.field_2;
                  local_2d8.m_reject_reason._M_string_length = 0;
                  local_2d8.m_reject_reason.field_2._M_local_buf[0] = '\0';
                  local_2d8.m_debug_message._M_dataplus._M_p =
                       (pointer)&local_2d8.m_debug_message.field_2;
                  local_2d8.m_debug_message._M_string_length = 0;
                  local_2d8.m_debug_message.field_2._M_local_buf[0] = '\0';
                  local_1c8 = (undefined1  [8])local_1b8;
                  local_1b8[0] = 'm';
                  local_1b8[1] = 'e';
                  local_1b8[2] = 'm';
                  local_1b8[3] = 'p';
                  local_1b8[4] = 'o';
                  local_1b8[5] = 'o';
                  local_1b8[6] = 'l';
                  local_1b8[7] = ' ';
                  local_1b8[8] = 'f';
                  local_1b8[9] = 'u';
                  local_1b8[10] = 'l';
                  local_1b8[0xb] = 'l';
                  auStack_1c0._0_4_ = 0xc;
                  auStack_1c0._4_4_ = TX_RESULT_UNSET;
                  local_1b8._12_4_ = local_1b8._12_4_ & 0xffffff00;
                  local_2f8._M_string_length = 0;
                  local_2f8.field_2._M_local_buf[0] = '\0';
                  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
                  ValidationState<TxValidationResult>::Invalid
                            (&local_2d8,TX_MEMPOOL_POLICY,(string *)local_1c8,&local_2f8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                    operator_delete(local_2f8._M_dataplus._M_p,
                                    CONCAT71(local_2f8.field_2._M_allocated_capacity._1_7_,
                                             local_2f8.field_2._M_local_buf[0]) + 1);
                  }
                  if (local_1c8 != (undefined1  [8])local_1b8) {
                    operator_delete((void *)local_1c8,CONCAT44(local_1b8._4_4_,local_1b8._0_4_) + 1)
                    ;
                  }
                  pVar30 = std::
                           _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                           ::equal_range(&local_b0,&__args->m_wrapped);
                  std::
                  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                  ::_M_erase_aux(&local_b0,(_Base_ptr)pVar30.first._M_node,
                                 (_Base_ptr)pVar30.second._M_node);
                  local_388._0_4_ = local_2d8.m_mode;
                  local_388._4_4_ = local_2d8.m_result;
                  local_380 = local_370;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_380,local_2d8.m_reject_reason._M_dataplus._M_p,
                             local_2d8.m_reject_reason._M_dataplus._M_p +
                             local_2d8.m_reject_reason._M_string_length);
                  local_360[0] = local_350;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_360,local_2d8.m_debug_message._M_dataplus._M_p,
                             local_2d8.m_debug_message._M_dataplus._M_p +
                             local_2d8.m_debug_message._M_string_length);
                  state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                  _M_p = (pointer)__args_00;
                  state_03.super_ValidationState<TxValidationResult>.m_mode =
                       (int)in_stack_fffffffffffff868;
                  state_03.super_ValidationState<TxValidationResult>.m_result =
                       (int)((ulong)in_stack_fffffffffffff868 >> 0x20);
                  state_03.super_ValidationState<TxValidationResult>.m_reject_reason.
                  _M_string_length = (size_type)package;
                  state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                  _M_allocated_capacity = (size_type)__return_storage_ptr__;
                  state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                  _M_local_buf[8] = in_stack_fffffffffffff888;
                  state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._9_7_ =
                       in_stack_fffffffffffff889;
                  state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus.
                  _M_p = (pointer)active_chainstate;
                  state_03.super_ValidationState<TxValidationResult>.m_debug_message.
                  _M_string_length = (size_type)in_stack_fffffffffffff898;
                  state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                  _M_allocated_capacity = (size_type)pvVar33;
                  state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                       hash;
                  MempoolAcceptResult::Failure((MempoolAcceptResult *)local_1c8,state_03);
                  std::
                  _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                  ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                            ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                              *)&local_b0,__args,(MempoolAcceptResult *)local_1c8);
                  if ((local_118 == true) &&
                     (local_118 = false,
                     local_130._M_value.
                     super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                    operator_delete(local_130._M_value.
                                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_130._M_value.
                                          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    local_130._0_8_);
                  }
                  std::__cxx11::
                  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              *)&local_178);
                  if (local_198._M_p != local_188) {
                    operator_delete(local_198._M_p,CONCAT71(local_188._1_7_,local_188[0]) + 1);
                  }
                  if ((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_) != local_1a8) {
                    operator_delete((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_),
                                    CONCAT35(local_1a8._5_3_,CONCAT41(local_1a8._1_4_,local_1a8[0]))
                                    + 1);
                  }
                  if (local_360[0] != local_350) {
                    operator_delete(local_360[0],local_350[0] + 1);
                  }
                  lVar21 = local_370[0];
                  plVar24 = local_380;
                  if (local_380 != local_370) goto LAB_003f82ec;
                  goto LAB_003f82f4;
                }
              }
            }
            else {
              std::
              _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
              ::find(&local_b0,&__args->m_wrapped);
              pmVar16 = std::
                        map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        ::at((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                              *)&local_200,&__args->m_wrapped);
              if (pmVar16->m_result_type == VALID) {
                uVar5 = *(undefined8 *)(__args->m_wrapped).super_base_blob<256U>.m_data._M_elems;
                uVar6 = *(undefined8 *)
                         ((long)&(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U> + 8);
                uVar7 = *(undefined8 *)
                         ((long)&(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U> + 0x10);
                uVar8 = *(undefined8 *)
                         ((long)&(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U> + 0x18);
                local_1b8._1_3_ = (undefined3)uVar7;
                local_1b8._4_4_ = (undefined4)((ulong)uVar7 >> 0x18);
                local_1b8[8] = (undefined1)((ulong)uVar7 >> 0x38);
                local_1b8._9_3_ = (undefined3)uVar8;
                local_1b8._12_4_ = (undefined4)((ulong)uVar8 >> 0x18);
                local_1a8[0] = (undefined1)((ulong)uVar8 >> 0x38);
                local_1c8._1_3_ = (undefined3)uVar5;
                local_1c8[0] = 1;
                local_1c8._4_4_ = (undefined4)((ulong)uVar5 >> 0x18);
                auStack_1c0[0] = SUB81((ulong)uVar5 >> 0x38,0);
                auStack_1c0._1_3_ = (undefined3)uVar6;
                auStack_1c0._4_4_ = (undefined4)((ulong)uVar6 >> 0x18);
                local_1b8[0] = (undefined1)((ulong)uVar6 >> 0x38);
                bVar9 = CTxMemPool::exists((CTxMemPool *)local_680._0_8_,(GenTxid *)local_1c8);
                if (!bVar9) {
                  local_1c8 = (undefined1  [8])local_1b8;
                  local_2d8.m_mode = 0x12;
                  local_2d8.m_result = TX_RESULT_UNSET;
                  pcVar11 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_1c8,(size_type *)&local_2d8,0);
                  local_1c8._0_4_ = SUB84(pcVar11,0);
                  local_1c8._4_4_ = (undefined4)((ulong)pcVar11 >> 0x20);
                  local_1b8._0_4_ = local_2d8.m_mode;
                  local_1b8._4_4_ = local_2d8.m_result;
                  builtin_strncpy(pcVar11,"transaction failed",0x12);
                  pcVar11[local_2d8._0_8_] = '\0';
                  local_2d8.m_reject_reason._M_dataplus._M_p = (pointer)0x0;
                  local_2d8.m_reject_reason._M_string_length =
                       local_2d8.m_reject_reason._M_string_length & 0xffffffffffffff00;
                  pCVar27 = __args_00;
                  local_2d8._0_8_ = (void *)((long)&local_2d8 + 0x10U);
                  auStack_1c0._0_4_ = local_1b8._0_4_;
                  auStack_1c0._4_4_ = local_1b8._4_4_;
                  ValidationState<PackageValidationResult>::Invalid
                            ((ValidationState<PackageValidationResult> *)local_248,PCKG_TX,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1c8,(string *)&local_2d8);
                  __args_00 = pCVar27;
                  if ((void *)local_2d8._0_8_ != (void *)((long)&local_2d8 + 0x10U)) {
                    operator_delete((void *)local_2d8._0_8_,
                                    local_2d8.m_reject_reason._M_string_length + 1);
                  }
                  if ((undefined1 *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != local_1b8) {
                    operator_delete((undefined1 *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_),
                                    CONCAT44(local_1b8._4_4_,local_1b8._0_4_) + 1);
                  }
                  local_2d8.m_mode = M_VALID;
                  local_2d8.m_result = TX_RESULT_UNSET;
                  local_2d8.m_reject_reason._M_dataplus._M_p =
                       (pointer)&local_2d8.m_reject_reason.field_2;
                  local_2d8.m_reject_reason._M_string_length = 0;
                  local_2d8.m_reject_reason.field_2._M_local_buf[0] = '\0';
                  local_2d8.m_debug_message._M_dataplus._M_p =
                       (pointer)&local_2d8.m_debug_message.field_2;
                  local_2d8.m_debug_message._M_string_length = 0;
                  local_2d8.m_debug_message.field_2._M_local_buf[0] = '\0';
                  local_1c8 = (undefined1  [8])local_1b8;
                  local_1b8[0] = 'm';
                  local_1b8[1] = 'e';
                  local_1b8[2] = 'm';
                  local_1b8[3] = 'p';
                  local_1b8[4] = 'o';
                  local_1b8[5] = 'o';
                  local_1b8[6] = 'l';
                  local_1b8[7] = ' ';
                  local_1b8[8] = 'f';
                  local_1b8[9] = 'u';
                  local_1b8[10] = 'l';
                  local_1b8[0xb] = 'l';
                  auStack_1c0._0_4_ = 0xc;
                  auStack_1c0._4_4_ = TX_RESULT_UNSET;
                  local_1b8._12_4_ = local_1b8._12_4_ & 0xffffff00;
                  local_2f8._M_string_length = 0;
                  local_2f8.field_2._M_local_buf[0] = '\0';
                  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
                  ValidationState<TxValidationResult>::Invalid
                            (&local_2d8,TX_MEMPOOL_POLICY,(string *)local_1c8,&local_2f8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                    operator_delete(local_2f8._M_dataplus._M_p,
                                    CONCAT71(local_2f8.field_2._M_allocated_capacity._1_7_,
                                             local_2f8.field_2._M_local_buf[0]) + 1);
                  }
                  if (local_1c8 != (undefined1  [8])local_1b8) {
                    operator_delete((void *)local_1c8,CONCAT44(local_1b8._4_4_,local_1b8._0_4_) + 1)
                    ;
                  }
                  local_340._0_4_ = local_2d8.m_mode;
                  local_340._4_4_ = local_2d8.m_result;
                  local_338 = local_328;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_338,local_2d8.m_reject_reason._M_dataplus._M_p,
                             local_2d8.m_reject_reason._M_dataplus._M_p +
                             local_2d8.m_reject_reason._M_string_length);
                  local_318[0] = local_308;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_318,local_2d8.m_debug_message._M_dataplus._M_p,
                             local_2d8.m_debug_message._M_dataplus._M_p +
                             local_2d8.m_debug_message._M_string_length);
                  state_04.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                  _M_p = (pointer)__args_00;
                  state_04.super_ValidationState<TxValidationResult>.m_mode =
                       (int)in_stack_fffffffffffff868;
                  state_04.super_ValidationState<TxValidationResult>.m_result =
                       (int)((ulong)in_stack_fffffffffffff868 >> 0x20);
                  state_04.super_ValidationState<TxValidationResult>.m_reject_reason.
                  _M_string_length = (size_type)package;
                  state_04.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                  _M_allocated_capacity = (size_type)__return_storage_ptr__;
                  state_04.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                  _M_local_buf[8] = in_stack_fffffffffffff888;
                  state_04.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._9_7_ =
                       in_stack_fffffffffffff889;
                  state_04.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus.
                  _M_p = (pointer)active_chainstate;
                  state_04.super_ValidationState<TxValidationResult>.m_debug_message.
                  _M_string_length = (size_type)in_stack_fffffffffffff898;
                  state_04.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                  _M_allocated_capacity = (size_type)pvVar33;
                  state_04.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                       hash;
                  MempoolAcceptResult::Failure((MempoolAcceptResult *)local_1c8,state_04);
                  std::
                  _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                  ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                            ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                              *)&local_b0,__args,(MempoolAcceptResult *)local_1c8);
                  if ((local_118 == true) &&
                     (local_118 = false,
                     local_130._M_value.
                     super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                    operator_delete(local_130._M_value.
                                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_130._M_value.
                                          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    local_130._0_8_);
                  }
                  std::__cxx11::
                  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              *)&local_178);
                  if (local_198._M_p != local_188) {
                    operator_delete(local_198._M_p,CONCAT71(local_188._1_7_,local_188[0]) + 1);
                  }
                  if ((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_) != local_1a8) {
                    operator_delete((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_),
                                    CONCAT35(local_1a8._5_3_,CONCAT41(local_1a8._1_4_,local_1a8[0]))
                                    + 1);
                  }
                  if (local_318[0] != local_308) {
                    operator_delete(local_318[0],local_308[0] + 1);
                  }
                  lVar21 = local_328[0];
                  plVar24 = local_338;
                  if (local_338 != local_328) {
LAB_003f82ec:
                    operator_delete(plVar24,lVar21 + 1);
                  }
LAB_003f82f4:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d8.m_debug_message._M_dataplus._M_p !=
                      &local_2d8.m_debug_message.field_2) {
                    operator_delete(local_2d8.m_debug_message._M_dataplus._M_p,
                                    CONCAT71(local_2d8.m_debug_message.field_2._M_allocated_capacity
                                             ._1_7_,local_2d8.m_debug_message.field_2._M_local_buf
                                                    [0]) + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d8.m_reject_reason._M_dataplus._M_p !=
                      &local_2d8.m_reject_reason.field_2) {
                    operator_delete(local_2d8.m_reject_reason._M_dataplus._M_p,
                                    CONCAT71(local_2d8.m_reject_reason.field_2._M_allocated_capacity
                                             ._1_7_,local_2d8.m_reject_reason.field_2._M_local_buf
                                                    [0]) + 1);
                  }
                  goto LAB_003f833e;
                }
              }
              std::
              _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
              ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult_const&>
                        ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                          *)&local_b0,__args,pmVar16);
            }
LAB_003f833e:
            pCVar20 = (pointer)((long)&(pCVar20->prevout).hash.m_wrapped.super_base_blob<256U>.
                                       m_data + 0x10);
          } while (pCVar20 != pCVar27);
        }
        local_1c8._0_4_ = (undefined4)CONCAT71(local_248._1_7_,local_248[0]);
        local_1c8._4_4_ = SUB74(local_248._1_7_,3);
        auStack_1c0 = (undefined1  [8])(local_1b8 + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)auStack_1c0,CONCAT71(local_248._9_7_,local_248[8]),
                   CONCAT71(local_248._17_7_,local_248[0x10]) +
                   CONCAT71(local_248._9_7_,local_248[8]));
        local_1a8._8_8_ = &local_190;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_1a8 + 8),local_220._M_p,local_220._M_p + local_218);
        state_05.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)__args_00;
        state_05.super_ValidationState<PackageValidationResult>.m_mode =
             (int)in_stack_fffffffffffff868;
        state_05.super_ValidationState<PackageValidationResult>.m_result =
             (int)((ulong)in_stack_fffffffffffff868 >> 0x20);
        state_05.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
             (size_type)package;
        state_05.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)__return_storage_ptr__;
        state_05.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_local_buf
        [8] = in_stack_fffffffffffff888;
        state_05.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._9_7_ =
             in_stack_fffffffffffff889;
        state_05.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)active_chainstate;
        state_05.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
             (size_type)in_stack_fffffffffffff898;
        state_05.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = (size_type)pvVar33;
        state_05.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ = hash
        ;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  (__return_storage_ptr__,state_05,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)local_1c8);
        if ((_Base_ptr *)local_1a8._8_8_ != &local_190) {
          operator_delete((void *)local_1a8._8_8_,(ulong)((long)&local_190->_M_color + 1));
        }
        if (auStack_1c0 != (undefined1  [8])(local_1b8 + 8)) {
          operator_delete((void *)auStack_1c0,
                          (ulong)((long)&(((_Vector_base<COutPoint,_std::allocator<COutPoint>_> *)
                                          &((_Base_ptr)local_1b8._8_8_)->_M_color)->_M_impl).
                                         super__Vector_impl_data._M_start + 1));
        }
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::~_Rb_tree(&local_200);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_p != &local_210) {
          operator_delete(local_220._M_p,local_210._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_248._9_7_,local_248[8]) != &aStack_230) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_248._9_7_,local_248[8]),
                          CONCAT71(aStack_230._1_7_,aStack_230._M_local_buf[0]) + 1);
        }
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector(&local_738);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::~_Rb_tree(&local_e0);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::~_Rb_tree(&local_b0);
        std::unique_lock<std::recursive_mutex>::~unique_lock(&local_690);
      }
      std::
      _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_718);
    }
    else {
      local_1c8._0_4_ = SUB84(local_80,0);
      local_1c8._4_4_ = (undefined4)((ulong)local_80 >> 0x20);
      auStack_1c0 = (undefined1  [8])(local_1b8 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_1c0,local_78._M_p,local_78._M_p + local_70);
      local_1a8._8_8_ = &local_190;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_1a8 + 8),local_58._M_p,local_50 + (long)local_58._M_p);
      local_248[0] = false;
      local_248[1] = '\0';
      local_248[2] = '\0';
      local_248[3] = '\0';
      local_248[4] = '\0';
      local_248[5] = '\0';
      local_248[6] = '\0';
      local_248[7] = '\0';
      local_248[8] = _S_red;
      local_248._9_7_ = 0;
      local_248[0x10] = '\0';
      local_248._17_7_ = 0;
      aStack_230._M_local_buf[0] = (char)(local_248 + 8);
      aStack_230._1_7_ = (undefined7)((ulong)(local_248 + 8) >> 8);
      local_220._M_p = (pointer)0x0;
      state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
           (pointer)in_stack_fffffffffffff870;
      state.super_ValidationState<PackageValidationResult>.m_mode = (int)in_stack_fffffffffffff868;
      state.super_ValidationState<PackageValidationResult>.m_result =
           (int)((ulong)in_stack_fffffffffffff868 >> 0x20);
      state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
           (size_type)package;
      state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
      _M_allocated_capacity = in_stack_fffffffffffff880;
      state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_local_buf[8] =
           in_stack_fffffffffffff888;
      state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._9_7_ =
           in_stack_fffffffffffff889;
      state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
           (pointer)in_stack_fffffffffffff890;
      state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
           (size_type)in_stack_fffffffffffff898;
      state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
      _M_allocated_capacity = in_stack_fffffffffffff8a0;
      state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ = hash;
      aStack_230._M_local_buf[8] = aStack_230._M_local_buf[0];
      aStack_230._9_7_ = aStack_230._1_7_;
      PackageMempoolAcceptResult::PackageMempoolAcceptResult
                (__return_storage_ptr__,state,
                 (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                  *)local_1c8);
LAB_003f6fc0:
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                   *)local_248);
      if ((_Base_ptr *)local_1a8._8_8_ != &local_190) {
        operator_delete((void *)local_1a8._8_8_,(ulong)((long)&local_190->_M_color + 1));
      }
      if (auStack_1c0 != (undefined1  [8])(local_1b8 + 8)) {
        operator_delete((void *)auStack_1c0,CONCAT44(local_1b8._12_4_,local_1b8._8_4_) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p,
                      CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,
                      CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
    }
    std::__cxx11::
    _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::_M_clear(&local_3b0);
    std::_Rb_tree<$270907ca$>::~_Rb_tree(&local_3e0);
    local_4b0 = &PTR_GetCoin_00b255a8;
    std::
    _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_458);
    std::
    _Hashtable<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::allocator<std::pair<const_COutPoint,_Coin>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_4a0);
    local_680._8_8_ = &PTR_GetCoin_00b2a3f0;
    std::
    _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_508);
    if (local_540 != '\0') {
      (local_548->second).m_prev = local_550;
      (local_550->second).m_next = local_548;
      local_540 = '\0';
    }
    if (0x1c < local_514) {
      free(local_530.indirect_contents.indirect);
      local_530.indirect_contents.indirect = (char *)0x0;
    }
    PoolResource<144UL,_8UL>::~PoolResource((PoolResource<144UL,_8UL> *)(local_648 + 8));
    pCVar34 = hash;
    if ((__return_storage_ptr__->m_state).super_ValidationState<PackageValidationResult>.m_mode !=
        M_INVALID) goto LAB_003f85d8;
  }
  for (; hash != pCStack_750; hash = hash + 1) {
    pCVar18 = Chainstate::CoinsTip(active_chainstate);
    CCoinsViewCache::Uncache(pCVar18,hash);
  }
LAB_003f85d8:
  local_680._0_8_ = (CTxMemPool *)0x0;
  local_680._16_8_ = (CCoinsView *)0x0;
  local_668._M_local_buf[0] = false;
  local_650 = 0;
  local_648[0] = '\0';
  local_680._8_8_ = local_680 + 0x18;
  local_658._M_p = local_648;
  Chainstate::FlushStateToDisk(active_chainstate,(BlockValidationState *)local_680,PERIODIC,0);
  if (local_658._M_p != local_648) {
    operator_delete(local_658._M_p,CONCAT71(local_648._1_7_,local_648[0]) + 1);
  }
  if ((undefined1 *)local_680._8_8_ != local_680 + 0x18) {
    operator_delete((void *)local_680._8_8_,
                    CONCAT71(local_668._M_allocated_capacity._1_7_,local_668._M_local_buf[0]) + 1);
  }
  if (pCVar34 != (COutPoint *)0x0) {
    operator_delete(pCVar34,-(long)pCVar34);
  }
  if (*(uint64_t *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

PackageMempoolAcceptResult ProcessNewPackage(Chainstate& active_chainstate, CTxMemPool& pool,
                                                   const Package& package, bool test_accept, const std::optional<CFeeRate>& client_maxfeerate)
{
    AssertLockHeld(cs_main);
    assert(!package.empty());
    assert(std::all_of(package.cbegin(), package.cend(), [](const auto& tx){return tx != nullptr;}));

    std::vector<COutPoint> coins_to_uncache;
    const CChainParams& chainparams = active_chainstate.m_chainman.GetParams();
    auto result = [&]() EXCLUSIVE_LOCKS_REQUIRED(cs_main) {
        AssertLockHeld(cs_main);
        if (test_accept) {
            auto args = MemPoolAccept::ATMPArgs::PackageTestAccept(chainparams, GetTime(), coins_to_uncache);
            return MemPoolAccept(pool, active_chainstate).AcceptMultipleTransactions(package, args);
        } else {
            auto args = MemPoolAccept::ATMPArgs::PackageChildWithParents(chainparams, GetTime(), coins_to_uncache, client_maxfeerate);
            return MemPoolAccept(pool, active_chainstate).AcceptPackage(package, args);
        }
    }